

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O3

void __thiscall
booster::locale::gnu_gettext::converter<char>::converter
          (converter<char> *this,string *out_enc,string *in_enc)

{
  pointer pcVar1;
  
  (this->out_)._M_dataplus._M_p = (pointer)&(this->out_).field_2;
  pcVar1 = (out_enc->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + out_enc->_M_string_length);
  (this->in_)._M_dataplus._M_p = (pointer)&(this->in_).field_2;
  pcVar1 = (in_enc->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->in_,pcVar1,pcVar1 + in_enc->_M_string_length);
  return;
}

Assistant:

converter(std::string out_enc,std::string in_enc) :
                    out_(out_enc),
                    in_(in_enc)
                {
                }